

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cpp
# Opt level: O0

int miniros::names::init(EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  undefined7 extraout_var;
  ulong uVar2;
  char *pcVar3;
  mapped_type *this;
  string resolved_right;
  string resolved_left;
  type *right;
  type *left;
  const_iterator __end2;
  const_iterator __begin2;
  M_string *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  type *in_stack_ffffffffffffff50;
  mapped_type *in_stack_ffffffffffffff58;
  key_type *in_stack_ffffffffffffff88;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff90;
  string local_58 [32];
  type *local_38;
  type *local_30;
  reference local_28;
  _Self local_20;
  _Self local_18;
  EVP_PKEY_CTX *local_10;
  EVP_PKEY_CTX *local_8;
  
  local_10 = ctx;
  local_8 = ctx;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_ffffffffffffff48);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_ffffffffffffff48);
  while( true ) {
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    local_28 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)0x471e94);
    local_30 = std::get<0ul,std::__cxx11::string_const,std::__cxx11::string>
                         ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)0x471ea9);
    local_38 = std::get<1ul,std::__cxx11::string_const,std::__cxx11::string>
                         ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)0x471ebe);
    uVar2 = std::__cxx11::string::empty();
    if (((uVar2 & 1) == 0) &&
       (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_30), *pcVar3 != '_')) {
      this_node::getName_abi_cxx11_();
      bVar1 = std::operator!=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      if (bVar1) {
        resolve(in_stack_ffffffffffffff58,SUB81((ulong)in_stack_ffffffffffffff50 >> 0x38,0));
        resolve(in_stack_ffffffffffffff58,SUB81((ulong)in_stack_ffffffffffffff50 >> 0x38,0));
        this = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        std::__cxx11::string::operator=((string *)this,(string *)&stack0xffffffffffffff88);
        in_stack_ffffffffffffff50 = local_38;
        in_stack_ffffffffffffff58 =
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        std::__cxx11::string::operator=
                  ((string *)in_stack_ffffffffffffff58,(string *)in_stack_ffffffffffffff50);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
        std::__cxx11::string::~string(local_58);
      }
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffff50);
  }
  return (int)CONCAT71(extraout_var,bVar1);
}

Assistant:

void init(const M_string& remappings)
{
  for (const auto& [left, right] : remappings)
  {
    if (!left.empty() && left[0] != '_' && left != this_node::getName())
    {
      std::string resolved_left = resolve(left, false);
      std::string resolved_right = resolve(right, false);
      g_remappings[resolved_left] = resolved_right;
      g_unresolved_remappings[left] = right;
    }
  }
}